

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O3

void make_happy_shk(monst *shkp,boolean silentkops)

{
  uint uVar1;
  boolean bVar2;
  xchar tolev;
  int iVar3;
  obj *poVar4;
  monst *pmVar5;
  bool bVar6;
  char *pcVar7;
  char shk_nam [256];
  char acStack_128 [256];
  
  uVar1 = *(uint *)&shkp->field_0x60;
  pacify_shk(shkp);
  *(undefined1 *)((long)&shkp[0x1b].meating + 1) = 0;
  shkp[0x1b].mtame = '\0';
  shkp[0x1b].m_ap_type = '\0';
  shkp[0x1b].mfrozen = '\0';
  shkp[0x1b].mblinded = '\0';
  if (urole.malenum != 0x164) {
    iVar3 = sgn((int)u.ualign.type);
    adjalign(iVar3);
  }
  iVar3 = inhishop(shkp);
  if (iVar3 == 0) {
    if (shkp->wormno == '\0') {
      if ((viz_array[shkp->my][shkp->mx] & 2U) != 0) goto LAB_0023bc1d;
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0023bbc0;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0023bbb7;
      }
      else {
LAB_0023bbb7:
        if (ublindf == (obj *)0x0) goto LAB_0023bc77;
LAB_0023bbc0:
        if (ublindf->oartifact != '\x1d') goto LAB_0023bc77;
      }
      if ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
         (((youmonst.data)->mflags3 & 0x100) == 0)) goto LAB_0023bc77;
      bVar6 = false;
      if (((viz_array[shkp->my][shkp->mx] & 1U) != 0) && ((shkp->data->mflags3 & 0x200) != 0))
      goto LAB_0023bc1d;
    }
    else {
      bVar2 = worm_known(level,shkp);
      if (bVar2 == '\0') {
LAB_0023bc77:
        bVar6 = false;
      }
      else {
LAB_0023bc1d:
        uVar1 = *(uint *)&shkp->field_0x60;
        if ((((uVar1 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)
           ) {
          if ((char)uVar1 < '\0') goto LAB_0023bc77;
        }
        else {
          bVar6 = false;
          if (((char)uVar1 < '\0') || (((youmonst.data)->mflags1 & 0x1000000) == 0))
          goto LAB_0023bc79;
        }
        bVar6 = (uVar1 >> 9 & 1) == 0 && (u._1052_1_ & 0x20) == 0;
      }
    }
LAB_0023bc79:
    pcVar7 = mon_nam(shkp);
    strcpy(acStack_128,pcVar7);
    bVar2 = on_level((d_level *)&shkp[0x1b].mxlth,&shkp->dlevel->z);
    if (bVar2 == '\0') {
      if (((shkp->data->mflags1 & 0x10000) == 0) &&
         ((poVar4 = which_armor(shkp,4), poVar4 == (obj *)0x0 ||
          (poVar4 = which_armor(shkp,4), poVar4->otyp != 0x4f)))) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0023bd39;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0023bd34;
LAB_0023be30:
          if ((u.uprops[0x19].extrinsic == 0) ||
             ((u.uprops[0x19].blocked != 0 ||
              (iVar3 = dist2((int)shkp->mx,(int)shkp->my,(int)u.ux,(int)u.uy), 0x40 < iVar3))))
          goto joined_r0x0023be80;
        }
        else {
LAB_0023bd34:
          if (ublindf != (obj *)0x0) {
LAB_0023bd39:
            if (ublindf->oartifact == '\x1d') goto LAB_0023be30;
          }
          if ((((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
               (u.uprops[0x19].extrinsic == 0 && u.uprops[0x19].intrinsic == 0)) &&
               youmonst.data != mons + 0x32) || (u.uprops[0x19].blocked != 0)) goto LAB_0023be30;
        }
LAB_0023be9e:
        bVar6 = true;
      }
      else {
joined_r0x0023be80:
        if ((u.uprops[0x42].intrinsic != 0) ||
           ((u.uprops[0x42].extrinsic != 0 || (bVar2 = match_warn_of_mon(shkp), bVar2 != '\0'))))
        goto LAB_0023be9e;
      }
      mdrop_special_objs(shkp);
      tolev = ledger_no((d_level *)&shkp[0x1b].mxlth);
      migrate_to_level(shkp,tolev,'\x01',(coord *)&shkp[0x1b].mintrinsics);
    }
    else {
      home_shk(shkp,'\0');
      if (shkp->wormno == '\0') {
        if ((viz_array[shkp->my][shkp->mx] & 2U) != 0) goto LAB_0023bf25;
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0023bdfb;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0023bdf2;
        }
        else {
LAB_0023bdf2:
          if (ublindf == (obj *)0x0) goto LAB_0023bf77;
LAB_0023bdfb:
          if (ublindf->oartifact != '\x1d') goto LAB_0023bf77;
        }
        if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
             (((youmonst.data)->mflags3 & 0x100) != 0)) &&
            ((viz_array[shkp->my][shkp->mx] & 1U) != 0)) && ((shkp->data->mflags3 & 0x200) != 0))
        goto LAB_0023bf25;
      }
      else {
        bVar2 = worm_known(level,shkp);
        if (bVar2 != '\0') {
LAB_0023bf25:
          uVar1 = *(uint *)&shkp->field_0x60;
          if ((((uVar1 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
             (u.uprops[0xc].extrinsic != 0)) {
            if ((uVar1 & 0x280) == 0) goto LAB_0023bf6e;
          }
          else if (((uVar1 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_0023bf6e:
            if ((u._1052_1_ & 0x20) == 0) goto LAB_0023bf8d;
          }
        }
      }
    }
LAB_0023bf77:
    if (!bVar6) goto LAB_0023bf8d;
    pcVar7 = "Satisfied, %s suddenly disappears!";
  }
  else {
    if ((uVar1 >> 0x16 & 1) != 0) goto LAB_0023bf8d;
    Monnam(shkp);
    pcVar7 = "%s calms down.";
  }
  pline(pcVar7);
LAB_0023bf8d:
  pmVar5 = level->monlist;
  while( true ) {
    pmVar5 = next_shkp(pmVar5,'\0');
    if (pmVar5 == (monst *)0x0) {
      kops_gone(silentkops);
      pacify_guards();
      return;
    }
    if ((pmVar5->field_0x62 & 0x40) == 0) break;
    pmVar5 = pmVar5->nmon;
  }
  return;
}

Assistant:

void make_happy_shk(struct monst *shkp, boolean silentkops)
{
	boolean wasmad = ANGRY(shkp);
	struct eshk *eshkp = ESHK(shkp);

	pacify_shk(shkp);
	eshkp->following = 0;
	eshkp->robbed = 0L;
	if (!Role_if (PM_ROGUE))
		adjalign(sgn(u.ualign.type));
	if (!inhishop(shkp)) {
		char shk_nam[BUFSZ];
		boolean vanished = canseemon(level, shkp);

		strcpy(shk_nam, mon_nam(shkp));
		if (on_level(&eshkp->shoplevel, &shkp->dlevel->z)) {
			home_shk(shkp, FALSE);
			/* didn't disappear if shk can still be seen */
			if (canseemon(level, shkp)) vanished = FALSE;
		} else {
			/* if sensed, does disappear regardless whether seen */
			if (sensemon(shkp)) vanished = TRUE;
			/* can't act as porter for the Amulet, even if shk
			   happens to be going farther down rather than up */
			mdrop_special_objs(shkp);
			/* arrive near shop's door */
			migrate_to_level(shkp, ledger_no(&eshkp->shoplevel),
					 MIGR_APPROX_XY, &eshkp->shd);
		}
		if (vanished)
		    pline("Satisfied, %s suddenly disappears!", shk_nam);
	} else if (wasmad)
		pline("%s calms down.", Monnam(shkp));

	if (!angry_shk_exists()) {
		kops_gone(silentkops);
		pacify_guards();
	}
}